

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O2

EdwardsPoint * ecc_edwards_multiply(EdwardsPoint *B,mp_int *n)

{
  uint swap;
  EdwardsPoint *orig;
  EdwardsPoint *P;
  EdwardsPoint *ep;
  size_t bit;
  EdwardsPoint *Q;
  EdwardsPoint *P_00;
  undefined4 local_4c;
  
  orig = ecc_edwards_add(B,B);
  P = ecc_edwards_point_copy(B);
  ep = ecc_edwards_point_copy(orig);
  bit = mp_max_bits(n);
  local_4c = 1;
  while (bit = bit - 1, bit != 0xffffffffffffffff) {
    swap = mp_get_bit(n,bit);
    Q = ecc_edwards_add(P,ep);
    ecc_edwards_cond_swap(P,ep,swap);
    P_00 = ecc_edwards_add(P,P);
    ecc_edwards_point_free(P);
    ecc_edwards_point_free(ep);
    ecc_edwards_cond_swap(P_00,Q,swap);
    ecc_edwards_cond_overwrite(P_00,B,local_4c);
    ecc_edwards_cond_overwrite(Q,orig,local_4c);
    local_4c = local_4c & ~swap;
    P = P_00;
    ep = Q;
  }
  ecc_edwards_point_free(orig);
  ecc_edwards_point_free(ep);
  return P;
}

Assistant:

EdwardsPoint *ecc_edwards_multiply(EdwardsPoint *B, mp_int *n)
{
    EdwardsPoint *two_B = ecc_edwards_add(B, B);
    EdwardsPoint *k_B = ecc_edwards_point_copy(B);
    EdwardsPoint *kplus1_B = ecc_edwards_point_copy(two_B);

    /*
     * Another copy of the same exponentiation routine following the
     * pattern of the Montgomery ladder, because it works as well as
     * any other technique and this way I didn't have to debug two of
     * them.
     */

    unsigned not_started_yet = 1;
    for (size_t bitindex = mp_max_bits(n); bitindex-- > 0 ;) {
        unsigned nbit = mp_get_bit(n, bitindex);

        EdwardsPoint *sum = ecc_edwards_add(k_B, kplus1_B);
        ecc_edwards_cond_swap(k_B, kplus1_B, nbit);
        EdwardsPoint *other = ecc_edwards_add(k_B, k_B);
        ecc_edwards_point_free(k_B);
        ecc_edwards_point_free(kplus1_B);
        k_B = other;
        kplus1_B = sum;
        ecc_edwards_cond_swap(k_B, kplus1_B, nbit);

        ecc_edwards_cond_overwrite(k_B, B, not_started_yet);
        ecc_edwards_cond_overwrite(kplus1_B, two_B, not_started_yet);
        not_started_yet &= ~nbit;
    }

    ecc_edwards_point_free(two_B);
    ecc_edwards_point_free(kplus1_B);
    return k_B;
}